

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_flags nk_convert(nk_context *ctx,nk_buffer *cmds,nk_buffer *vertices,nk_buffer *elements,
                   nk_convert_config *config)

{
  nk_draw_list *list;
  ushort uVar1;
  uint uVar2;
  void *pvVar3;
  nk_size nVar4;
  nk_draw_vertex_layout_element *pnVar5;
  nk_handle nVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  nk_anti_aliasing nVar22;
  nk_anti_aliasing nVar23;
  nk_anti_aliasing nVar24;
  nk_anti_aliasing nVar25;
  nk_command *pnVar26;
  nk_draw_list_stroke closed;
  nk_command_scissor *s;
  nk_color nVar27;
  ulong uVar28;
  nk_vec2 pos;
  nk_vec2 a;
  nk_vec2 pos_00;
  nk_vec2 pos_01;
  nk_vec2 center;
  nk_vec2 p0;
  nk_vec2 center_00;
  nk_vec2 a_00;
  nk_vec2 pos_02;
  nk_vec2 center_01;
  nk_vec2 a_01;
  nk_vec2 pos_03;
  nk_vec2 center_02;
  undefined1 auVar29 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  undefined1 auVar41 [16];
  undefined1 auVar44 [16];
  undefined1 auVar47 [16];
  undefined1 auVar50 [16];
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  nk_vec2 b;
  nk_vec2 cp0;
  nk_vec2 b_00;
  float fVar63;
  nk_vec2 b_01;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  nk_vec2 c;
  nk_vec2 cp1;
  nk_vec2 c_00;
  undefined1 auVar71 [16];
  nk_vec2 p1;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect rect_03;
  nk_rect rect_04;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined2 uVar62;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x2844,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (cmds == (nk_buffer *)0x0) {
    __assert_fail("cmds",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x2845,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (vertices == (nk_buffer *)0x0) {
    __assert_fail("vertices",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x2846,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (elements == (nk_buffer *)0x0) {
    __assert_fail("elements",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x2847,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (config == (nk_convert_config *)0x0) {
    __assert_fail("config",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x2848,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (config->vertex_layout == (nk_draw_vertex_layout_element *)0x0) {
    __assert_fail("config->vertex_layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x2849,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (config->vertex_size == 0) {
    __assert_fail("config->vertex_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x284a,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  (ctx->draw_list).buffer = cmds;
  nVar24 = config->line_AA;
  nVar25 = config->shape_AA;
  nVar4 = config->vertex_alignment;
  (ctx->draw_list).config.vertex_size = config->vertex_size;
  (ctx->draw_list).config.vertex_alignment = nVar4;
  pnVar5 = config->vertex_layout;
  (ctx->draw_list).config.null.uv = (config->null).uv;
  (ctx->draw_list).config.vertex_layout = pnVar5;
  uVar2 = config->curve_segment_count;
  nVar6 = (config->null).texture;
  (ctx->draw_list).config.arc_segment_count = config->arc_segment_count;
  (ctx->draw_list).config.curve_segment_count = uVar2;
  (ctx->draw_list).config.null.texture = nVar6;
  nVar22 = config->line_AA;
  nVar23 = config->shape_AA;
  uVar2 = config->circle_segment_count;
  (ctx->draw_list).config.global_alpha = config->global_alpha;
  (ctx->draw_list).config.line_AA = nVar22;
  (ctx->draw_list).config.shape_AA = nVar23;
  (ctx->draw_list).config.circle_segment_count = uVar2;
  (ctx->draw_list).elements = elements;
  (ctx->draw_list).vertices = vertices;
  (ctx->draw_list).line_AA = nVar24;
  (ctx->draw_list).shape_AA = nVar25;
  (ctx->draw_list).clip_rect = nk_null_rect;
  (ctx->draw_list).element_count = 0;
  (ctx->draw_list).vertex_count = 0;
  (ctx->draw_list).cmd_offset = 0;
  (ctx->draw_list).cmd_count = 0;
  (ctx->draw_list).path_count = 0;
  pnVar26 = nk__begin(ctx);
  if (pnVar26 != (nk_command *)0x0) {
    list = &ctx->draw_list;
    do {
      switch(pnVar26->type) {
      case NK_COMMAND_SCISSOR:
        uVar28 = *(ulong *)(pnVar26 + 1);
        uVar62 = (undefined2)(uVar28 >> 0x30);
        auVar31._8_4_ = 0;
        auVar31._0_8_ = uVar28;
        auVar31._12_2_ = uVar62;
        auVar31._14_2_ = uVar62;
        uVar62 = (undefined2)(uVar28 >> 0x20);
        auVar30._12_4_ = auVar31._12_4_;
        auVar30._8_2_ = 0;
        auVar30._0_8_ = uVar28;
        auVar30._10_2_ = uVar62;
        auVar29._10_6_ = auVar30._10_6_;
        auVar29._8_2_ = uVar62;
        auVar29._0_8_ = uVar28;
        uVar62 = (undefined2)(uVar28 >> 0x10);
        auVar7._4_8_ = auVar29._8_8_;
        auVar7._2_2_ = uVar62;
        auVar7._0_2_ = uVar62;
        rect.x = (float)(int)(short)uVar28;
        rect.y = (float)(auVar7._0_4_ >> 0x10);
        uVar2 = *(uint *)&pnVar26[1].field_0x4;
        auVar64._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
        auVar64._4_2_ = (short)(uVar2 >> 0x10);
        auVar64._0_4_ = uVar2;
        rect.w = (float)(uVar2 & 0xffff);
        rect.h = (float)auVar64._4_4_;
        nk_draw_list_add_clip(list,rect);
        break;
      case NK_COMMAND_LINE:
        auVar34 = ZEXT416(*(uint *)((long)&pnVar26[1].type + 2));
        auVar34 = pshuflw(auVar34,auVar34,0x60);
        a_00.x = (float)(auVar34._0_4_ >> 0x10);
        a_00.y = (float)(auVar34._4_4_ >> 0x10);
        auVar34 = pshuflw(ZEXT416(*(uint *)&pnVar26[1].field_0x6),
                          ZEXT416(*(uint *)&pnVar26[1].field_0x6),0x60);
        b_00.x = (float)(auVar34._0_4_ >> 0x10);
        b_00.y = (float)(auVar34._4_4_ >> 0x10);
        nk_draw_list_stroke_line
                  (list,a_00,b_00,*(nk_color *)((long)&pnVar26[1].next + 2),
                   (float)(ushort)(short)pnVar26[1].type);
        break;
      case NK_COMMAND_CURVE:
        auVar34 = ZEXT416(*(uint *)((long)&pnVar26[1].type + 2));
        auVar34 = pshuflw(auVar34,auVar34,0x60);
        p0.x = (float)(auVar34._0_4_ >> 0x10);
        p0.y = (float)(auVar34._4_4_ >> 0x10);
        auVar34 = ZEXT416(*(uint *)((long)&pnVar26[1].next + 2));
        auVar34 = pshuflw(auVar34,auVar34,0x60);
        cp0.x = (float)(auVar34._0_4_ >> 0x10);
        cp0.y = (float)(auVar34._4_4_ >> 0x10);
        auVar34 = ZEXT416(*(uint *)((long)&pnVar26[1].next + 6));
        auVar34 = pshuflw(auVar34,auVar34,0x60);
        cp1.x = (float)(auVar34._0_4_ >> 0x10);
        cp1.y = (float)(auVar34._4_4_ >> 0x10);
        auVar34 = pshuflw(ZEXT416(*(uint *)&pnVar26[1].field_0x6),
                          ZEXT416(*(uint *)&pnVar26[1].field_0x6),0x60);
        p1.x = (float)(auVar34._0_4_ >> 0x10);
        p1.y = (float)(auVar34._4_4_ >> 0x10);
        nk_draw_list_stroke_curve
                  (list,p0,cp0,cp1,p1,*(nk_color *)((long)&pnVar26[2].type + 2),
                   config->curve_segment_count,(float)(ushort)(short)pnVar26[1].type);
        break;
      case NK_COMMAND_RECT:
        auVar34 = pshuflw(ZEXT416(*(uint *)&pnVar26[1].field_0x4),
                          ZEXT416(*(uint *)&pnVar26[1].field_0x4),0x60);
        rect_03.x = (float)(auVar34._0_4_ >> 0x10);
        rect_03.y = (float)(auVar34._4_4_ >> 0x10);
        uVar28 = pnVar26[1].next;
        auVar20._8_4_ = 0;
        auVar20._0_8_ = uVar28;
        auVar20._12_2_ = (short)(uVar28 >> 0x30);
        auVar21._8_2_ = (short)(uVar28 >> 0x20);
        auVar21._0_8_ = uVar28;
        auVar21._10_4_ = auVar20._10_4_;
        auVar14._2_10_ = SUB1610(ZEXT616(auVar21._8_6_) << 0x40,6);
        auVar14._0_2_ = (short)(uVar28 >> 0x10);
        rect_03.w = (float)(ushort)uVar28;
        rect_03.h = (float)auVar14._0_4_;
        nk_draw_list_stroke_rect
                  (list,rect_03,*(nk_color *)((long)&pnVar26[1].next + 4),
                   (float)(ushort)(short)pnVar26[1].type,
                   (float)(ushort)*(undefined2 *)((long)&pnVar26[1].type + 2));
        break;
      case NK_COMMAND_RECT_FILLED:
        auVar34 = ZEXT416(*(uint *)((long)&pnVar26[1].type + 2));
        auVar34 = pshuflw(auVar34,auVar34,0x60);
        rect_01.x = (float)(auVar34._0_4_ >> 0x10);
        rect_01.y = (float)(auVar34._4_4_ >> 0x10);
        uVar2 = *(uint *)&pnVar26[1].field_0x6;
        auVar66._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
        auVar66._4_2_ = (short)(uVar2 >> 0x10);
        auVar66._0_4_ = uVar2;
        rect_01.w = (float)(uVar2 & 0xffff);
        rect_01.h = (float)auVar66._4_4_;
        nk_draw_list_fill_rect
                  (list,rect_01,*(nk_color *)((long)&pnVar26[1].next + 2),
                   (float)(ushort)(short)pnVar26[1].type);
        break;
      case NK_COMMAND_RECT_MULTI_COLOR:
        uVar28 = *(ulong *)(pnVar26 + 1);
        uVar62 = (undefined2)(uVar28 >> 0x30);
        auVar52._8_4_ = 0;
        auVar52._0_8_ = uVar28;
        auVar52._12_2_ = uVar62;
        auVar52._14_2_ = uVar62;
        uVar62 = (undefined2)(uVar28 >> 0x20);
        auVar51._12_4_ = auVar52._12_4_;
        auVar51._8_2_ = 0;
        auVar51._0_8_ = uVar28;
        auVar51._10_2_ = uVar62;
        auVar50._10_6_ = auVar51._10_6_;
        auVar50._8_2_ = uVar62;
        auVar50._0_8_ = uVar28;
        uVar62 = (undefined2)(uVar28 >> 0x10);
        auVar16._4_8_ = auVar50._8_8_;
        auVar16._2_2_ = uVar62;
        auVar16._0_2_ = uVar62;
        rect_04.x = (float)(int)(short)uVar28;
        rect_04.y = (float)(auVar16._0_4_ >> 0x10);
        uVar2 = *(uint *)&pnVar26[1].field_0x4;
        auVar69._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
        auVar69._4_2_ = (short)(uVar2 >> 0x10);
        auVar69._0_4_ = uVar2;
        rect_04.w = (float)(uVar2 & 0xffff);
        rect_04.h = (float)auVar69._4_4_;
        nVar27.r = pnVar26[2].field_0x4;
        nVar27.g = pnVar26[2].field_0x5;
        nVar27.b = pnVar26[2].field_0x6;
        nVar27.a = pnVar26[2].field_0x7;
        nk_draw_list_fill_rect_multi_color
                  (list,rect_04,*(nk_color *)&pnVar26[1].next,
                   *(nk_color *)((long)&pnVar26[1].next + 4),nVar27,(nk_color)pnVar26[2].type);
        break;
      case NK_COMMAND_CIRCLE:
        uVar28 = *(ulong *)(pnVar26 + 1);
        uVar62 = (undefined2)(uVar28 >> 0x30);
        auVar55._8_4_ = 0;
        auVar55._0_8_ = uVar28;
        auVar55._12_2_ = uVar62;
        auVar55._14_2_ = uVar62;
        uVar62 = (undefined2)(uVar28 >> 0x20);
        auVar54._12_4_ = auVar55._12_4_;
        auVar54._8_2_ = 0;
        auVar54._0_8_ = uVar28;
        auVar54._10_2_ = uVar62;
        auVar53._10_6_ = auVar54._10_6_;
        auVar53._8_2_ = uVar62;
        auVar53._0_8_ = uVar28;
        uVar62 = (undefined2)(uVar28 >> 0x10);
        auVar17._4_8_ = auVar53._8_8_;
        auVar17._2_2_ = uVar62;
        auVar17._0_2_ = uVar62;
        uVar2 = *(uint *)&pnVar26[1].field_0x6;
        auVar70._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
        auVar70._4_2_ = (short)(uVar2 >> 0x10);
        auVar70._0_4_ = uVar2;
        fVar63 = (float)(uVar2 & 0xffff) * 0.5;
        center_01.x = (float)(int)(short)uVar28 + fVar63;
        center_01.y = (float)(auVar17._0_4_ >> 0x10) + (float)auVar70._4_4_ * 0.5;
        nk_draw_list_stroke_circle
                  (list,center_01,fVar63,*(nk_color *)((long)&pnVar26[1].next + 2),
                   config->circle_segment_count,(float)*(ushort *)&pnVar26[1].field_0x4);
        break;
      case NK_COMMAND_CIRCLE_FILLED:
        uVar28 = *(ulong *)(pnVar26 + 1);
        uVar62 = (undefined2)(uVar28 >> 0x30);
        auVar49._8_4_ = 0;
        auVar49._0_8_ = uVar28;
        auVar49._12_2_ = uVar62;
        auVar49._14_2_ = uVar62;
        uVar62 = (undefined2)(uVar28 >> 0x20);
        auVar48._12_4_ = auVar49._12_4_;
        auVar48._8_2_ = 0;
        auVar48._0_8_ = uVar28;
        auVar48._10_2_ = uVar62;
        auVar47._10_6_ = auVar48._10_6_;
        auVar47._8_2_ = uVar62;
        auVar47._0_8_ = uVar28;
        uVar62 = (undefined2)(uVar28 >> 0x10);
        auVar15._4_8_ = auVar47._8_8_;
        auVar15._2_2_ = uVar62;
        auVar15._0_2_ = uVar62;
        uVar2 = *(uint *)&pnVar26[1].field_0x4;
        auVar68._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
        auVar68._4_2_ = (short)(uVar2 >> 0x10);
        auVar68._0_4_ = uVar2;
        fVar63 = (float)(uVar2 & 0xffff) * 0.5;
        center_00.x = (float)(int)(short)uVar28 + fVar63;
        center_00.y = (float)(auVar15._0_4_ >> 0x10) + (float)auVar68._4_4_ * 0.5;
        nk_draw_list_fill_circle
                  (list,center_00,fVar63,*(nk_color *)&pnVar26[1].next,config->circle_segment_count)
        ;
        break;
      case NK_COMMAND_ARC:
        uVar28 = *(ulong *)(pnVar26 + 1);
        uVar62 = (undefined2)(uVar28 >> 0x30);
        auVar58._8_4_ = 0;
        auVar58._0_8_ = uVar28;
        auVar58._12_2_ = uVar62;
        auVar58._14_2_ = uVar62;
        uVar62 = (undefined2)(uVar28 >> 0x20);
        auVar57._12_4_ = auVar58._12_4_;
        auVar57._8_2_ = 0;
        auVar57._0_8_ = uVar28;
        auVar57._10_2_ = uVar62;
        auVar56._10_6_ = auVar57._10_6_;
        auVar56._8_2_ = uVar62;
        auVar56._0_8_ = uVar28;
        uVar62 = (undefined2)(uVar28 >> 0x10);
        auVar18._4_8_ = auVar56._8_8_;
        auVar18._2_2_ = uVar62;
        auVar18._0_2_ = uVar62;
        pos_03.x = (float)(int)(short)uVar28;
        pos_03.y = (float)(auVar18._0_4_ >> 0x10);
        nk_draw_list_path_line_to(list,pos_03);
        uVar28 = *(ulong *)(pnVar26 + 1);
        uVar62 = (undefined2)(uVar28 >> 0x30);
        auVar61._8_4_ = 0;
        auVar61._0_8_ = uVar28;
        auVar61._12_2_ = uVar62;
        auVar61._14_2_ = uVar62;
        uVar62 = (undefined2)(uVar28 >> 0x20);
        auVar60._12_4_ = auVar61._12_4_;
        auVar60._8_2_ = 0;
        auVar60._0_8_ = uVar28;
        auVar60._10_2_ = uVar62;
        auVar59._10_6_ = auVar60._10_6_;
        auVar59._8_2_ = uVar62;
        auVar59._0_8_ = uVar28;
        uVar62 = (undefined2)(uVar28 >> 0x10);
        auVar19._4_8_ = auVar59._8_8_;
        auVar19._2_2_ = uVar62;
        auVar19._0_2_ = uVar62;
        center_02.x = (float)(int)(short)uVar28;
        center_02.y = (float)(auVar19._0_4_ >> 0x10);
        nk_draw_list_path_arc_to
                  (list,center_02,(float)*(ushort *)&pnVar26[1].field_0x4,*(float *)&pnVar26[1].next
                   ,*(float *)((long)&pnVar26[1].next + 4),config->arc_segment_count);
        uVar1 = *(ushort *)&pnVar26[1].field_0x6;
        nVar27 = (nk_color)pnVar26[2].type;
        goto LAB_001228ce;
      case NK_COMMAND_ARC_FILLED:
        uVar28 = *(ulong *)(pnVar26 + 1);
        uVar62 = (undefined2)(uVar28 >> 0x30);
        auVar40._8_4_ = 0;
        auVar40._0_8_ = uVar28;
        auVar40._12_2_ = uVar62;
        auVar40._14_2_ = uVar62;
        uVar62 = (undefined2)(uVar28 >> 0x20);
        auVar39._12_4_ = auVar40._12_4_;
        auVar39._8_2_ = 0;
        auVar39._0_8_ = uVar28;
        auVar39._10_2_ = uVar62;
        auVar38._10_6_ = auVar39._10_6_;
        auVar38._8_2_ = uVar62;
        auVar38._0_8_ = uVar28;
        uVar62 = (undefined2)(uVar28 >> 0x10);
        auVar11._4_8_ = auVar38._8_8_;
        auVar11._2_2_ = uVar62;
        auVar11._0_2_ = uVar62;
        pos_01.x = (float)(int)(short)uVar28;
        pos_01.y = (float)(auVar11._0_4_ >> 0x10);
        nk_draw_list_path_line_to(list,pos_01);
        uVar28 = *(ulong *)(pnVar26 + 1);
        uVar62 = (undefined2)(uVar28 >> 0x30);
        auVar43._8_4_ = 0;
        auVar43._0_8_ = uVar28;
        auVar43._12_2_ = uVar62;
        auVar43._14_2_ = uVar62;
        uVar62 = (undefined2)(uVar28 >> 0x20);
        auVar42._12_4_ = auVar43._12_4_;
        auVar42._8_2_ = 0;
        auVar42._0_8_ = uVar28;
        auVar42._10_2_ = uVar62;
        auVar41._10_6_ = auVar42._10_6_;
        auVar41._8_2_ = uVar62;
        auVar41._0_8_ = uVar28;
        uVar62 = (undefined2)(uVar28 >> 0x10);
        auVar12._4_8_ = auVar41._8_8_;
        auVar12._2_2_ = uVar62;
        auVar12._0_2_ = uVar62;
        center.x = (float)(int)(short)uVar28;
        center.y = (float)(auVar12._0_4_ >> 0x10);
        nk_draw_list_path_arc_to
                  (list,center,(float)*(ushort *)&pnVar26[1].field_0x4,*(float *)&pnVar26[1].next,
                   *(float *)((long)&pnVar26[1].next + 4),config->arc_segment_count);
        nVar27 = (nk_color)pnVar26[2].type;
        goto LAB_001227ce;
      case NK_COMMAND_TRIANGLE:
        auVar34 = ZEXT416(*(uint *)((long)&pnVar26[1].type + 2));
        auVar34 = pshuflw(auVar34,auVar34,0x60);
        a_01.x = (float)(auVar34._0_4_ >> 0x10);
        a_01.y = (float)(auVar34._4_4_ >> 0x10);
        auVar34 = pshuflw(ZEXT416(*(uint *)&pnVar26[1].field_0x6),
                          ZEXT416(*(uint *)&pnVar26[1].field_0x6),0x60);
        b_01.x = (float)(auVar34._0_4_ >> 0x10);
        b_01.y = (float)(auVar34._4_4_ >> 0x10);
        auVar34 = ZEXT416(*(uint *)((long)&pnVar26[1].next + 2));
        auVar34 = pshuflw(auVar34,auVar34,0x60);
        c_00.x = (float)(auVar34._0_4_ >> 0x10);
        c_00.y = (float)(auVar34._4_4_ >> 0x10);
        nk_draw_list_stroke_triangle
                  (list,a_01,b_01,c_00,*(nk_color *)((long)&pnVar26[1].next + 6),
                   (float)(ushort)(short)pnVar26[1].type);
        break;
      case NK_COMMAND_TRIANGLE_FILLED:
        uVar28 = *(ulong *)(pnVar26 + 1);
        uVar62 = (undefined2)(uVar28 >> 0x30);
        auVar37._8_4_ = 0;
        auVar37._0_8_ = uVar28;
        auVar37._12_2_ = uVar62;
        auVar37._14_2_ = uVar62;
        uVar62 = (undefined2)(uVar28 >> 0x20);
        auVar36._12_4_ = auVar37._12_4_;
        auVar36._8_2_ = 0;
        auVar36._0_8_ = uVar28;
        auVar36._10_2_ = uVar62;
        auVar35._10_6_ = auVar36._10_6_;
        auVar35._8_2_ = uVar62;
        auVar35._0_8_ = uVar28;
        uVar62 = (undefined2)(uVar28 >> 0x10);
        auVar9._4_8_ = auVar35._8_8_;
        auVar9._2_2_ = uVar62;
        auVar9._0_2_ = uVar62;
        a.x = (float)(int)(short)uVar28;
        a.y = (float)(auVar9._0_4_ >> 0x10);
        auVar34 = pshuflw(ZEXT416(*(uint *)&pnVar26[1].field_0x4),
                          ZEXT416(*(uint *)&pnVar26[1].field_0x4),0x60);
        b.x = (float)(auVar34._0_4_ >> 0x10);
        b.y = (float)(auVar34._4_4_ >> 0x10);
        uVar28 = pnVar26[1].next;
        uVar62 = (undefined2)(uVar28 >> 0x30);
        auVar73._8_4_ = 0;
        auVar73._0_8_ = uVar28;
        auVar73._12_2_ = uVar62;
        auVar73._14_2_ = uVar62;
        uVar62 = (undefined2)(uVar28 >> 0x20);
        auVar72._12_4_ = auVar73._12_4_;
        auVar72._8_2_ = 0;
        auVar72._0_8_ = uVar28;
        auVar72._10_2_ = uVar62;
        auVar71._10_6_ = auVar72._10_6_;
        auVar71._8_2_ = uVar62;
        auVar71._0_8_ = uVar28;
        uVar62 = (undefined2)(uVar28 >> 0x10);
        auVar10._4_8_ = auVar71._8_8_;
        auVar10._2_2_ = uVar62;
        auVar10._0_2_ = uVar62;
        c.x = (float)(int)(short)uVar28;
        c.y = (float)(auVar10._0_4_ >> 0x10);
        nk_draw_list_fill_triangle(list,a,b,c,*(nk_color *)((long)&pnVar26[1].next + 4));
        break;
      case NK_COMMAND_POLYGON:
        if (*(short *)&pnVar26[1].field_0x6 != 0) {
          uVar28 = 0;
          do {
            auVar34 = ZEXT416(*(uint *)((long)&pnVar26[1].next + uVar28 * 4));
            auVar34 = pshuflw(auVar34,auVar34,0x60);
            pos_00.x = (float)(auVar34._0_4_ >> 0x10);
            pos_00.y = (float)(auVar34._4_4_ >> 0x10);
            nk_draw_list_path_line_to(list,pos_00);
            uVar28 = uVar28 + 1;
          } while (uVar28 < *(ushort *)&pnVar26[1].field_0x6);
        }
        uVar1 = *(ushort *)&pnVar26[1].field_0x4;
        nVar27 = (nk_color)pnVar26[1].type;
LAB_001228ce:
        closed = NK_STROKE_CLOSED;
LAB_001228d6:
        nk_draw_list_path_stroke(list,nVar27,closed,(float)uVar1);
        break;
      case NK_COMMAND_POLYGON_FILLED:
        if (*(short *)&pnVar26[1].field_0x4 != 0) {
          uVar28 = 0;
          do {
            auVar34 = pshuflw(ZEXT416(*(uint *)(&pnVar26[1].field_0x6 + uVar28 * 4)),
                              ZEXT416(*(uint *)(&pnVar26[1].field_0x6 + uVar28 * 4)),0x60);
            pos_02.x = (float)(auVar34._0_4_ >> 0x10);
            pos_02.y = (float)(auVar34._4_4_ >> 0x10);
            nk_draw_list_path_line_to(list,pos_02);
            uVar28 = uVar28 + 1;
          } while (uVar28 < *(ushort *)&pnVar26[1].field_0x4);
        }
        nVar27 = (nk_color)pnVar26[1].type;
LAB_001227ce:
        nk_draw_list_path_fill(list,nVar27);
        break;
      case NK_COMMAND_POLYLINE:
        if (*(short *)&pnVar26[1].field_0x6 != 0) {
          uVar28 = 0;
          do {
            auVar34 = ZEXT416(*(uint *)((long)&pnVar26[1].next + uVar28 * 4));
            auVar34 = pshuflw(auVar34,auVar34,0x60);
            pos.x = (float)(auVar34._0_4_ >> 0x10);
            pos.y = (float)(auVar34._4_4_ >> 0x10);
            nk_draw_list_path_line_to(list,pos);
            uVar28 = uVar28 + 1;
          } while (uVar28 < *(ushort *)&pnVar26[1].field_0x6);
        }
        uVar1 = *(ushort *)&pnVar26[1].field_0x4;
        nVar27 = (nk_color)pnVar26[1].type;
        closed = NK_STROKE_OPEN;
        goto LAB_001228d6;
      case NK_COMMAND_TEXT:
        uVar28 = *(ulong *)(pnVar26 + 2);
        uVar62 = (undefined2)(uVar28 >> 0x30);
        auVar46._8_4_ = 0;
        auVar46._0_8_ = uVar28;
        auVar46._12_2_ = uVar62;
        auVar46._14_2_ = uVar62;
        uVar62 = (undefined2)(uVar28 >> 0x20);
        auVar45._12_4_ = auVar46._12_4_;
        auVar45._8_2_ = 0;
        auVar45._0_8_ = uVar28;
        auVar45._10_2_ = uVar62;
        auVar44._10_6_ = auVar45._10_6_;
        auVar44._8_2_ = uVar62;
        auVar44._0_8_ = uVar28;
        uVar62 = (undefined2)(uVar28 >> 0x10);
        auVar13._4_8_ = auVar44._8_8_;
        auVar13._2_2_ = uVar62;
        auVar13._0_2_ = uVar62;
        rect_02.x = (float)(int)(short)uVar28;
        rect_02.y = (float)(auVar13._0_4_ >> 0x10);
        uVar2 = *(uint *)&pnVar26[2].field_0x4;
        auVar67._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
        auVar67._4_2_ = (short)(uVar2 >> 0x10);
        auVar67._0_4_ = uVar2;
        rect_02.w = (float)(uVar2 & 0xffff);
        rect_02.h = (float)auVar67._4_4_;
        nk_draw_list_add_text
                  (list,*(nk_user_font **)(pnVar26 + 1),rect_02,(char *)(pnVar26 + 3),
                   *(int *)((long)&pnVar26[2].next + 4),*(float *)&pnVar26[2].next,
                   *(nk_color *)((long)&pnVar26[1].next + 4));
        break;
      case NK_COMMAND_IMAGE:
        uVar28 = *(ulong *)(pnVar26 + 1);
        uVar62 = (undefined2)(uVar28 >> 0x30);
        auVar33._8_4_ = 0;
        auVar33._0_8_ = uVar28;
        auVar33._12_2_ = uVar62;
        auVar33._14_2_ = uVar62;
        uVar62 = (undefined2)(uVar28 >> 0x20);
        auVar32._12_4_ = auVar33._12_4_;
        auVar32._8_2_ = 0;
        auVar32._0_8_ = uVar28;
        auVar32._10_2_ = uVar62;
        auVar34._10_6_ = auVar32._10_6_;
        auVar34._8_2_ = uVar62;
        auVar34._0_8_ = uVar28;
        uVar62 = (undefined2)(uVar28 >> 0x10);
        auVar8._4_8_ = auVar34._8_8_;
        auVar8._2_2_ = uVar62;
        auVar8._0_2_ = uVar62;
        rect_00.x = (float)(int)(short)uVar28;
        rect_00.y = (float)(auVar8._0_4_ >> 0x10);
        uVar2 = *(uint *)&pnVar26[1].field_0x4;
        auVar65._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
        auVar65._4_2_ = (short)(uVar2 >> 0x10);
        auVar65._0_4_ = uVar2;
        rect_00.w = (float)(uVar2 & 0xffff);
        rect_00.h = (float)auVar65._4_4_;
        nk_draw_list_add_image(list,*(nk_image *)&pnVar26[1].next,rect_00,(nk_color)pnVar26[3].type)
        ;
        break;
      case NK_COMMAND_CUSTOM:
        (**(code **)(pnVar26 + 2))
                  (list,(int)(short)pnVar26[1].type,
                   (int)(short)*(undefined2 *)((long)&pnVar26[1].type + 2),
                   *(undefined2 *)&pnVar26[1].field_0x4,*(undefined2 *)&pnVar26[1].field_0x6,
                   pnVar26[1].next);
      }
    } while (((ctx->count != 0) && (pnVar26->next < (ctx->memory).allocated)) &&
            (pvVar3 = (ctx->memory).memory.ptr,
            pnVar26 = (nk_command *)(pnVar26->next + (long)pvVar3), pvVar3 != (void *)0x0));
  }
  return (uint)(vertices->allocated < vertices->needed) * 4 +
         (uint)(((cmds->memory).size + cmds->allocated) - cmds->size < cmds->needed) * 2 +
         (uint)(elements->allocated < elements->needed) * 8;
}

Assistant:

NK_API nk_flags
nk_convert(struct nk_context *ctx, struct nk_buffer *cmds,
    struct nk_buffer *vertices, struct nk_buffer *elements,
    const struct nk_convert_config *config)
{
    nk_flags res = NK_CONVERT_SUCCESS;
    const struct nk_command *cmd;
    NK_ASSERT(ctx);
    NK_ASSERT(cmds);
    NK_ASSERT(vertices);
    NK_ASSERT(elements);
    NK_ASSERT(config);
    NK_ASSERT(config->vertex_layout);
    NK_ASSERT(config->vertex_size);
    if (!ctx || !cmds || !vertices || !elements || !config || !config->vertex_layout)
        return NK_CONVERT_INVALID_PARAM;

    nk_draw_list_setup(&ctx->draw_list, config, cmds, vertices, elements,
        config->line_AA, config->shape_AA);
    nk_foreach(cmd, ctx)
    {
#ifdef NK_INCLUDE_COMMAND_USERDATA
        ctx->draw_list.userdata = cmd->userdata;
#endif
        switch (cmd->type) {
        case NK_COMMAND_NOP: break;
        case NK_COMMAND_SCISSOR: {
            const struct nk_command_scissor *s = (const struct nk_command_scissor*)cmd;
            nk_draw_list_add_clip(&ctx->draw_list, nk_rect(s->x, s->y, s->w, s->h));
        } break;
        case NK_COMMAND_LINE: {
            const struct nk_command_line *l = (const struct nk_command_line*)cmd;
            nk_draw_list_stroke_line(&ctx->draw_list, nk_vec2(l->begin.x, l->begin.y),
                nk_vec2(l->end.x, l->end.y), l->color, l->line_thickness);
        } break;
        case NK_COMMAND_CURVE: {
            const struct nk_command_curve *q = (const struct nk_command_curve*)cmd;
            nk_draw_list_stroke_curve(&ctx->draw_list, nk_vec2(q->begin.x, q->begin.y),
                nk_vec2(q->ctrl[0].x, q->ctrl[0].y), nk_vec2(q->ctrl[1].x,
                q->ctrl[1].y), nk_vec2(q->end.x, q->end.y), q->color,
                config->curve_segment_count, q->line_thickness);
        } break;
        case NK_COMMAND_RECT: {
            const struct nk_command_rect *r = (const struct nk_command_rect*)cmd;
            nk_draw_list_stroke_rect(&ctx->draw_list, nk_rect(r->x, r->y, r->w, r->h),
                r->color, (float)r->rounding, r->line_thickness);
        } break;
        case NK_COMMAND_RECT_FILLED: {
            const struct nk_command_rect_filled *r = (const struct nk_command_rect_filled*)cmd;
            nk_draw_list_fill_rect(&ctx->draw_list, nk_rect(r->x, r->y, r->w, r->h),
                r->color, (float)r->rounding);
        } break;
        case NK_COMMAND_RECT_MULTI_COLOR: {
            const struct nk_command_rect_multi_color *r = (const struct nk_command_rect_multi_color*)cmd;
            nk_draw_list_fill_rect_multi_color(&ctx->draw_list, nk_rect(r->x, r->y, r->w, r->h),
                r->left, r->top, r->right, r->bottom);
        } break;
        case NK_COMMAND_CIRCLE: {
            const struct nk_command_circle *c = (const struct nk_command_circle*)cmd;
            nk_draw_list_stroke_circle(&ctx->draw_list, nk_vec2((float)c->x + (float)c->w/2,
                (float)c->y + (float)c->h/2), (float)c->w/2, c->color,
                config->circle_segment_count, c->line_thickness);
        } break;
        case NK_COMMAND_CIRCLE_FILLED: {
            const struct nk_command_circle_filled *c = (const struct nk_command_circle_filled *)cmd;
            nk_draw_list_fill_circle(&ctx->draw_list, nk_vec2((float)c->x + (float)c->w/2,
                (float)c->y + (float)c->h/2), (float)c->w/2, c->color,
                config->circle_segment_count);
        } break;
        case NK_COMMAND_ARC: {
            const struct nk_command_arc *c = (const struct nk_command_arc*)cmd;
            nk_draw_list_path_line_to(&ctx->draw_list, nk_vec2(c->cx, c->cy));
            nk_draw_list_path_arc_to(&ctx->draw_list, nk_vec2(c->cx, c->cy), c->r,
                c->a[0], c->a[1], config->arc_segment_count);
            nk_draw_list_path_stroke(&ctx->draw_list, c->color, NK_STROKE_CLOSED, c->line_thickness);
        } break;
        case NK_COMMAND_ARC_FILLED: {
            const struct nk_command_arc_filled *c = (const struct nk_command_arc_filled*)cmd;
            nk_draw_list_path_line_to(&ctx->draw_list, nk_vec2(c->cx, c->cy));
            nk_draw_list_path_arc_to(&ctx->draw_list, nk_vec2(c->cx, c->cy), c->r,
                c->a[0], c->a[1], config->arc_segment_count);
            nk_draw_list_path_fill(&ctx->draw_list, c->color);
        } break;
        case NK_COMMAND_TRIANGLE: {
            const struct nk_command_triangle *t = (const struct nk_command_triangle*)cmd;
            nk_draw_list_stroke_triangle(&ctx->draw_list, nk_vec2(t->a.x, t->a.y),
                nk_vec2(t->b.x, t->b.y), nk_vec2(t->c.x, t->c.y), t->color,
                t->line_thickness);
        } break;
        case NK_COMMAND_TRIANGLE_FILLED: {
            const struct nk_command_triangle_filled *t = (const struct nk_command_triangle_filled*)cmd;
            nk_draw_list_fill_triangle(&ctx->draw_list, nk_vec2(t->a.x, t->a.y),
                nk_vec2(t->b.x, t->b.y), nk_vec2(t->c.x, t->c.y), t->color);
        } break;
        case NK_COMMAND_POLYGON: {
            int i;
            const struct nk_command_polygon*p = (const struct nk_command_polygon*)cmd;
            for (i = 0; i < p->point_count; ++i) {
                struct nk_vec2 pnt = nk_vec2((float)p->points[i].x, (float)p->points[i].y);
                nk_draw_list_path_line_to(&ctx->draw_list, pnt);
            }
            nk_draw_list_path_stroke(&ctx->draw_list, p->color, NK_STROKE_CLOSED, p->line_thickness);
        } break;
        case NK_COMMAND_POLYGON_FILLED: {
            int i;
            const struct nk_command_polygon_filled *p = (const struct nk_command_polygon_filled*)cmd;
            for (i = 0; i < p->point_count; ++i) {
                struct nk_vec2 pnt = nk_vec2((float)p->points[i].x, (float)p->points[i].y);
                nk_draw_list_path_line_to(&ctx->draw_list, pnt);
            }
            nk_draw_list_path_fill(&ctx->draw_list, p->color);
        } break;
        case NK_COMMAND_POLYLINE: {
            int i;
            const struct nk_command_polyline *p = (const struct nk_command_polyline*)cmd;
            for (i = 0; i < p->point_count; ++i) {
                struct nk_vec2 pnt = nk_vec2((float)p->points[i].x, (float)p->points[i].y);
                nk_draw_list_path_line_to(&ctx->draw_list, pnt);
            }
            nk_draw_list_path_stroke(&ctx->draw_list, p->color, NK_STROKE_OPEN, p->line_thickness);
        } break;
        case NK_COMMAND_TEXT: {
            const struct nk_command_text *t = (const struct nk_command_text*)cmd;
            nk_draw_list_add_text(&ctx->draw_list, t->font, nk_rect(t->x, t->y, t->w, t->h),
                t->string, t->length, t->height, t->foreground);
        } break;
        case NK_COMMAND_IMAGE: {
            const struct nk_command_image *i = (const struct nk_command_image*)cmd;
            nk_draw_list_add_image(&ctx->draw_list, i->img, nk_rect(i->x, i->y, i->w, i->h), i->col);
        } break;
        case NK_COMMAND_CUSTOM: {
            const struct nk_command_custom *c = (const struct nk_command_custom*)cmd;
            c->callback(&ctx->draw_list, c->x, c->y, c->w, c->h, c->callback_data);
        } break;
        default: break;
        }
    }
    res |= (cmds->needed > cmds->allocated + (cmds->memory.size - cmds->size)) ? NK_CONVERT_COMMAND_BUFFER_FULL: 0;
    res |= (vertices->needed > vertices->allocated) ? NK_CONVERT_VERTEX_BUFFER_FULL: 0;
    res |= (elements->needed > elements->allocated) ? NK_CONVERT_ELEMENT_BUFFER_FULL: 0;
    return res;
}